

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  reference pvVar2;
  reference pvVar3;
  size_t *psVar4;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *siglen;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar5;
  float fVar6;
  undefined4 extraout_XMM0_Da;
  double dVar7;
  double dVar8;
  float w;
  int64_t c;
  float k;
  int i;
  float u;
  float s;
  float final_prediction;
  label_data *ld;
  learner<char,_example> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  learner<char,_example> *this;
  int local_30;
  float local_28;
  float local_24;
  
  local_24 = 0.0;
  local_28 = 0.0;
  fVar1 = *(float *)(in_RDX + 0x6870);
  *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + 1;
  siglen = in_RDX;
  sig = in_RSI;
  ctx = in_RDI;
  for (local_30 = 0; local_30 < *(int *)in_RDI; local_30 = local_30 + 1) {
    fVar5 = floorf(((float)(*(int *)in_RDI - local_30) - local_28) / 2.0);
    if (*(int *)in_RDI - (local_30 + 1) < 0) {
      this = (learner<char,_example> *)0x0;
    }
    else if (fVar5 <= (float)(*(int *)in_RDI - (local_30 + 1))) {
      if (0.0 <= fVar5) {
        pvVar2 = std::
                 vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               *)(in_RDI + 0x30),(long)(*(int *)in_RDI - (local_30 + 1)));
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,(long)fVar5);
        if (*pvVar3 == -1) {
          in_stack_ffffffffffffffb0 =
               (learner<char,_example> *)choose((long)(*(int *)in_RDI - (local_30 + 1)),(long)fVar5)
          ;
          this = in_stack_ffffffffffffffb0;
          pvVar2 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 *)(in_RDI + 0x30),(long)(*(int *)in_RDI - (local_30 + 1)));
          psVar4 = (size_t *)
                   std::vector<long,_std::allocator<long>_>::operator[](pvVar2,(long)fVar5);
          *psVar4 = (size_t)in_stack_ffffffffffffffb0;
        }
        else {
          pvVar2 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 *)(in_RDI + 0x30),(long)(*(int *)in_RDI - (local_30 + 1)));
          psVar4 = (size_t *)
                   std::vector<long,_std::allocator<long>_>::operator[](pvVar2,(long)fVar5);
          this = (learner<char,_example> *)*psVar4;
        }
      }
      else {
        this = (learner<char,_example> *)0x0;
      }
    }
    else {
      this = (learner<char,_example> *)0x0;
    }
    fVar6 = (float)(long)this;
    dVar7 = pow((double)*(float *)(in_RDI + 4) + 0.5,(double)fVar5);
    dVar8 = pow(0.5 - (double)*(float *)(in_RDI + 4),
                (double)((float)(*(int *)in_RDI - (local_30 + 1)) - fVar5));
    fVar5 = fVar6 * (float)dVar7 * (float)dVar8;
    *(float *)(in_RDX + 0x6870) = fVar1 * fVar5;
    LEARNER::learner<char,_example>::predict
              (this,(example *)CONCAT44(fVar5,in_stack_ffffffffffffffb8),
               (size_t)in_stack_ffffffffffffffb0);
    local_28 = *(float *)(in_RDX + 0x6828) * *(float *)(in_RDX + 0x6850) + local_28;
    local_24 = *(float *)(in_RDX + 0x6850) + local_24;
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::learn
              (this,(example *)CONCAT44(fVar5,in_stack_ffffffffffffffb8),
               (size_t)in_stack_ffffffffffffffb0);
    siglen = extraout_RDX;
  }
  *(float *)(in_RDX + 0x6870) = fVar1;
  *(float *)(in_RDX + 0x68a8) = local_24;
  sign(ctx,(uchar *)sig,(size_t *)siglen,(uchar *)in_RDI,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  fVar1 = *(float *)(in_RDX + 0x6828);
  if ((fVar1 != *(float *)(in_RDX + 0x6850)) || (NAN(fVar1) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}